

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O2

void __thiscall OpenMD::StatWriter::writeArray(StatWriter *this,int i)

{
  uint uVar1;
  ulong uVar2;
  vector<double,_std::allocator<double>_> s;
  _Vector_base<double,_std::allocator<double>_> local_68;
  string local_50;
  
  Stats::getArrayData((vector<double,_std::allocator<double>_> *)&local_68,this->stats_,i);
  uVar1 = 0;
  while( true ) {
    uVar2 = (ulong)uVar1;
    if ((ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar2) break;
    if ((ulong)ABS(local_68._M_impl.super__Vector_impl_data._M_start[uVar2]) < 0x7ff0000000000000) {
      std::operator<<((ostream *)this,"\t");
      std::ostream::_M_insert<double>(local_68._M_impl.super__Vector_impl_data._M_start[uVar2]);
    }
    else {
      Stats::getTitle_abi_cxx11_(&local_50,this->stats_,i);
      snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s",
               local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      painCave.isFatal = 1;
      simError();
    }
    uVar1 = uVar1 + 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void StatWriter::writeArray(int i) {
    std::vector<RealType> s = stats_->getArrayData(i);

    for (unsigned int j = 0; j < s.size(); ++j) {
      if (std::isinf(s[j]) || std::isnan(s[j])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "StatWriter detected a numerical error writing: %s",
                 stats_->getTitle(i).c_str());
        painCave.isFatal = 1;
        simError();
      } else {
        statfile_ << "\t" << s[j];
      }
    }
  }